

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_csr.c
# Opt level: O0

void mbedtls_x509_csr_free(mbedtls_x509_csr *csr)

{
  mbedtls_asn1_named_data *pmVar1;
  mbedtls_x509_name *name_prv;
  mbedtls_x509_name *name_cur;
  mbedtls_x509_csr *csr_local;
  
  if (csr != (mbedtls_x509_csr *)0x0) {
    mbedtls_pk_free(&csr->pk);
    free(csr->sig_opts);
    name_prv = (csr->subject).next;
    while (name_prv != (mbedtls_x509_name *)0x0) {
      pmVar1 = name_prv->next;
      mbedtls_zeroize(name_prv,0x40);
      free(name_prv);
      name_prv = pmVar1;
    }
    if ((csr->raw).p != (uchar *)0x0) {
      mbedtls_zeroize((csr->raw).p,(csr->raw).len);
      free((csr->raw).p);
    }
    mbedtls_zeroize(csr,0xe0);
  }
  return;
}

Assistant:

void mbedtls_x509_csr_free( mbedtls_x509_csr *csr )
{
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;

    if( csr == NULL )
        return;

    mbedtls_pk_free( &csr->pk );

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
    mbedtls_free( csr->sig_opts );
#endif

    name_cur = csr->subject.next;
    while( name_cur != NULL )
    {
        name_prv = name_cur;
        name_cur = name_cur->next;
        mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
        mbedtls_free( name_prv );
    }

    if( csr->raw.p != NULL )
    {
        mbedtls_zeroize( csr->raw.p, csr->raw.len );
        mbedtls_free( csr->raw.p );
    }

    mbedtls_zeroize( csr, sizeof( mbedtls_x509_csr ) );
}